

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O2

ctmbstr prvTidyEntityName(uint ch,uint versions)

{
  uint *puVar1;
  
  for (puVar1 = &entities[0].versions;
      (((entity *)(puVar1 + -2))->name != (ctmbstr)0x0 &&
      ((puVar1[1] != ch || ((*puVar1 & versions) == 0)))); puVar1 = puVar1 + 4) {
  }
  return ((entity *)(puVar1 + -2))->name;
}

Assistant:

ctmbstr TY_(EntityName)( uint ch, uint versions )
{
    ctmbstr entnam = NULL;
    const entity *ep;

    for ( ep = entities; ep->name != NULL; ++ep )
    {
        if ( ep->code == ch )
        {
            if (ep->versions & versions)
            {
                entnam = ep->name;
                break; /* Issue #643 - Found code and version. Stop search? */
            }
        }
    }
    return entnam;
}